

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_symbol_get_description(JSContext *ctx,JSValue this_val)

{
  JSAtom atom;
  JSValue v;
  JSValue JVar1;
  
  v = js_thisSymbolValue(ctx,this_val);
  if ((int)v.tag != 6) {
    atom = js_get_atom_index(ctx->rt,(JSAtomStruct *)v.u.ptr);
    JVar1 = JS_AtomToString(ctx,atom);
    JS_FreeValue(ctx,v);
    v.tag = JVar1.tag;
    v.u.ptr = (void *)((ulong)JVar1.u._0_4_ | (ulong)JVar1.u.ptr & 0xffffffff00000000);
  }
  return v;
}

Assistant:

static JSValue js_symbol_get_description(JSContext *ctx, JSValueConst this_val)
{
    JSValue val, ret;
    JSAtomStruct *p;

    val = js_thisSymbolValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_PTR(val);
    if (p->len == 0 && p->is_wide_char != 0) {
        ret = JS_UNDEFINED;
    } else {
        ret = JS_AtomToString(ctx, js_get_atom_index(ctx->rt, p));
    }
    JS_FreeValue(ctx, val);
    return ret;
}